

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjExporter.h
# Opt level: O3

bool __thiscall
Assimp::ObjExporter::vertexDataCompare::operator()
          (vertexDataCompare *this,vertexData *a,vertexData *b)

{
  ai_real *paVar1;
  float fVar2;
  float fVar3;
  
  fVar2 = (a->vp).x;
  fVar3 = (b->vp).x;
  if (fVar2 < fVar3) {
    return true;
  }
  if (fVar2 <= fVar3) {
    fVar2 = (a->vp).y;
    fVar3 = (b->vp).y;
    if (fVar2 < fVar3) {
      return true;
    }
    if (fVar2 <= fVar3) {
      fVar2 = (a->vp).z;
      fVar3 = (b->vp).z;
      if (fVar2 < fVar3) {
        return true;
      }
      if (fVar2 <= fVar3) {
        fVar2 = (a->vc).r;
        fVar3 = (b->vc).r;
        if (fVar2 < fVar3) {
          return true;
        }
        if (fVar2 <= fVar3) {
          fVar2 = (a->vc).g;
          fVar3 = (b->vc).g;
          if (fVar2 < fVar3) {
            return true;
          }
          if ((fVar2 <= fVar3) &&
             (fVar2 = (b->vc).b, paVar1 = &(a->vc).b, *paVar1 <= fVar2 && fVar2 != *paVar1)) {
            return true;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool operator() ( const vertexData& a, const vertexData& b ) const {
            // position
            if (a.vp.x < b.vp.x) return true;
            if (a.vp.x > b.vp.x) return false;
            if (a.vp.y < b.vp.y) return true;
            if (a.vp.y > b.vp.y) return false;
            if (a.vp.z < b.vp.z) return true;
            if (a.vp.z > b.vp.z) return false;

            // color
            if (a.vc.r < b.vc.r) return true;
            if (a.vc.r > b.vc.r) return false;
            if (a.vc.g < b.vc.g) return true;
            if (a.vc.g > b.vc.g) return false;
            if (a.vc.b < b.vc.b) return true;
            if (a.vc.b > b.vc.b) return false;
            return false;
        }